

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

void __thiscall fasttext::Args::printBasicHelp(Args *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments are mandatory:\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -input              training file path\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -weights            weights file path (binary)\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -output             output file path\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments are optional:\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"  -verbose            verbosity level [",0x27);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->verbose);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  return;
}

Assistant:

void Args::printBasicHelp() {
  std::cerr << "\nThe following arguments are mandatory:\n"
            << "  -input              training file path\n"
            << "  -weights            weights file path (binary)\n"
            << "  -output             output file path\n"
            << "\nThe following arguments are optional:\n"
            << "  -verbose            verbosity level [" << verbose << "]\n";
}